

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_Event.h
# Opt level: O2

void __thiscall
axl::sys::NameableEventBase<axl::sl::False>::NameableEventBase
          (NameableEventBase<axl::sl::False> *this)

{
  (this->m_name).super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_hdr = (BufHdr *)0x0;
  (this->m_name).super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_length = 0;
  (this->m_mapping).m_size = 0;
  (this->m_name).super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_p = (C *)0x0;
  this->m_event = (EventImpl *)0x0;
  (this->m_mapping).m_p = (void *)0x0;
  (this->m_name).super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_isNullTerminated =
       false;
  create(this);
  return;
}

Assistant:

NameableEventBase() {
		m_event = NULL;
		create();
	}